

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void llvm::SmallVectorTemplateBase<unsigned_char,true>::
     uninitialized_copy<unsigned_char,unsigned_char>(uchar *I,uchar *E,uchar *Dest,type *param_4)

{
  type *param_3_local;
  uchar *Dest_local;
  uchar *E_local;
  uchar *I_local;
  
  if (I != E) {
    memcpy(Dest,I,(long)E - (long)I);
  }
  return;
}

Assistant:

static void uninitialized_copy(
      T1 *I, T1 *E, T2 *Dest,
      typename std::enable_if<std::is_same<typename std::remove_const<T1>::type,
                                           T2>::value>::type * = nullptr) {
    // Use memcpy for PODs iterated by pointers (which includes SmallVector
    // iterators): std::uninitialized_copy optimizes to memmove, but we can
    // use memcpy here. Note that I and E are iterators and thus might be
    // invalid for memcpy if they are equal.
    if (I != E)
      memcpy(Dest, I, (E - I) * sizeof(T));
  }